

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_test(function *fn,int A,int B,int C,int j,int jA,int pc)

{
  int jA_local;
  int j_local;
  int C_local;
  int B_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  if (C == 0) {
    membuff_add_string(&fn->body,"result = !l_isfalse(ra);\n");
  }
  else {
    membuff_add_string(&fn->body,"result = l_isfalse(ra);\n");
  }
  membuff_add_fstring(&fn->body,"if (!result) {\n",(ulong)(uint)A);
  if (0 < jA) {
    membuff_add_fstring(&fn->body," ra = R(%d);\n",(ulong)(jA - 1));
    membuff_add_string(&fn->body," luaF_close(L, ra, LUA_OK);\n");
    membuff_add_string(&fn->body," base = ci->u.l.base;\n");
  }
  membuff_add_fstring(&fn->body,"  goto Lbc_%d;\n",(ulong)(uint)j);
  membuff_add_string(&fn->body," }\n");
  return;
}

Assistant:

static void emit_op_test(struct function *fn, int A, int B, int C, int j, int jA, int pc) {
  (void)pc;
  (void)B;
  emit_reg(fn, "ra", A);
  if (C) {
    membuff_add_string(&fn->body, "result = l_isfalse(ra);\n");
  }
  else {
    membuff_add_string(&fn->body, "result = !l_isfalse(ra);\n");
  }
  membuff_add_fstring(&fn->body, "if (!result) {\n", A);
  if (jA > 0) {
    membuff_add_fstring(&fn->body, " ra = R(%d);\n", jA - 1);
#ifdef RAVI_DEFER_STATEMENT
    membuff_add_string(&fn->body, " luaF_close(L, ra, LUA_OK);\n");
    membuff_add_string(&fn->body, " base = ci->u.l.base;\n");
#else
    membuff_add_string(&fn->body, " luaF_close(L, ra);\n");
#endif
  }
  membuff_add_fstring(&fn->body, "  goto Lbc_%d;\n", j);
  membuff_add_string(&fn->body, " }\n");
}